

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_28(QPDF *pdf,char *arg2)

{
  QPDFObjectHandle QVar1;
  QPDFObjectHandle QVar2;
  undefined1 local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long *local_60 [2];
  long local_50 [2];
  element_type local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  element_type local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  QPDF::getTrailer();
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"/QTest","");
  QPDFObjectHandle::getKey(local_70);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_30;
  QPDF::copyForeignObject(QVar1);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"oops -- didn\'t throw",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  QPDFObjectHandle::newInteger((longlong)local_90);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_40;
  QPDF::copyForeignObject(QVar2);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"oops -- didn\'t throw",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

static void
test_28(QPDF& pdf, char const* arg2)
{
    // Copy foreign object errors
    try {
        pdf.copyForeignObject(pdf.getTrailer().getKey("/QTest"));
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
    try {
        pdf.copyForeignObject(QPDFObjectHandle::newInteger(1));
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
}